

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

char * kwsysSystem_Shell__GetArgument(char *in,char *out,int isUnix,int flags)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  
  iVar1 = kwsysSystem_Shell__ArgumentNeedsQuotes(in,isUnix,flags);
  bVar7 = (byte)flags;
  if (iVar1 != 0) {
    if ((char)bVar7 < '\0') {
      if (isUnix != 0) {
        *out = '\"';
        out = out + 1;
      }
      *out = '\'';
    }
    else {
      *out = '\"';
    }
    out = out + 1;
  }
  uVar8 = 0;
  for (; bVar6 = *in, bVar6 != 0; in = (char *)((byte *)in + 1)) {
    if (((flags & 0x40U) != 0) &&
       (pbVar2 = (byte *)kwsysSystem_Shell__SkipMakeVariables(in), pbVar2 != (byte *)in)) {
      for (; (byte *)in != pbVar2; in = (char *)((byte *)in + 1)) {
        *out = *in;
        out = (char *)((byte *)out + 1);
      }
      bVar6 = *in;
      uVar8 = 0;
      if (bVar6 == 0) break;
    }
    if (isUnix == 0) {
      if ((flags & 4U) != 0) goto LAB_003b5219;
      if (bVar6 != 0x5c) {
        uVar4 = uVar8;
        uVar9 = 0;
        if (bVar6 == 0x22) {
          for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            *out = 0x5c;
            out = (char *)((byte *)out + 1);
          }
          uVar8 = uVar8 & (int)uVar8 >> 0x1f;
          goto LAB_003b51e9;
        }
        goto LAB_003b5220;
      }
      uVar9 = uVar8 + 1;
      bVar6 = 0x5c;
LAB_003b52a1:
      *out = bVar6;
LAB_003b52a4:
      out = (char *)((byte *)out + 1);
    }
    else {
      uVar4 = bVar6 - 0x22;
      uVar9 = uVar8;
      if ((uVar4 < 0x3f) && ((0x4400000000000005U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
LAB_003b51e9:
        *out = 0x5c;
        out = (char *)((byte *)out + 1);
LAB_003b5219:
        bVar6 = *in;
        uVar9 = uVar8;
      }
LAB_003b5220:
      if (bVar6 == 0x23) {
        if ((flags & 9U) == 9) {
          ((byte *)out)[0] = 0x24;
          ((byte *)out)[1] = 0x23;
          goto LAB_003b527f;
        }
        *out = 0x23;
        goto LAB_003b52a4;
      }
      if (bVar6 != 0x3b) {
        if (bVar6 == 0x25) {
          *out = 0x25;
          if (((flags & 0x30U) != 0 & bVar7) != 0 || (char)((flags & 2U) >> 1) != '\0') {
            ((byte *)out)[1] = 0x25;
LAB_003b527f:
            out = (char *)((byte *)out + 2);
            goto LAB_003b52a7;
          }
        }
        else {
          if (bVar6 != 0x24) goto LAB_003b52a1;
          if ((flags & 1U) != 0) {
            ((byte *)out)[0] = 0x24;
            ((byte *)out)[1] = 0x24;
            goto LAB_003b527f;
          }
          if ((flags & 2U) != 0) {
            ((byte *)out)[0] = 0x22;
            ((byte *)out)[1] = 0x24;
            goto LAB_003b52b7;
          }
          *out = 0x24;
        }
        goto LAB_003b52a4;
      }
      if ((flags & 2U) == 0) {
        *out = 0x3b;
        goto LAB_003b52a4;
      }
      ((byte *)out)[0] = 0x22;
      ((byte *)out)[1] = 0x3b;
LAB_003b52b7:
      ((byte *)out)[2] = 0x22;
      out = (char *)((byte *)out + 3);
    }
LAB_003b52a7:
    uVar8 = uVar9;
  }
  pbVar2 = (byte *)out;
  if (iVar1 != 0) {
    pbVar3 = (byte *)out;
    for (lVar5 = 0; 0 < (int)(uVar8 + (int)lVar5); lVar5 = lVar5 + -1) {
      *pbVar3 = 0x5c;
      pbVar3 = pbVar3 + 1;
    }
    pbVar2 = (byte *)out + (1 - lVar5);
    if ((char)bVar7 < '\0') {
      *pbVar3 = 0x27;
      if (isUnix == 0) goto LAB_003b5304;
      pbVar3 = pbVar2;
      pbVar2 = (byte *)out + (2 - lVar5);
    }
    *pbVar3 = 0x22;
  }
LAB_003b5304:
  *pbVar2 = 0;
  return (char *)pbVar2;
}

Assistant:

static char* kwsysSystem_Shell__GetArgument(const char* in, char* out,
                                            int isUnix, int flags)
{
  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = kwsysSystem_Shell__ArgumentNeedsQuotes(in, isUnix, flags);
  if(needQuotes)
    {
    /* Add the opening quote for this argument.  */
    if(flags & kwsysSystem_Shell_Flag_WatcomQuote)
      {
      if(isUnix)
        {
        *out++ = '"';
        }
      *out++ = '\'';
      }
    else
      {
      *out++ = '"';
      }
    }

  /* Scan the string for characters that require escaping or quoting.  */
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
      const char* skip = kwsysSystem_Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* Copy to the end of the make variable references.  */
        while(c != skip)
          {
          *out++ = *c++;
          }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if(!*c)
          {
          break;
          }
        }
      }

    /* Check whether this character needs escaping for the shell.  */
    if(isUnix)
      {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if(*c == '\\' || *c == '"' || *c == '`' || *c == '$')
        {
        /* This character needs a backslash to escape it.  */
        *out++ = '\\';
        }
      }
    else if(flags & kwsysSystem_Shell_Flag_EchoWindows)
      {
      /* On Windows the built-in command shell echo never needs escaping.  */
      }
    else
      {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if(*c == '\\')
        {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
        }
      else if(*c == '"')
        {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while(windows_backslashes > 0)
          {
          --windows_backslashes;
          *out++ = '\\';
          }

        /* Add the backslash to escape the double-quote.  */
        *out++ = '\\';
        }
      else
        {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
        }
      }

    /* Check whether this character needs escaping for a make tool.  */
    if(*c == '$')
      {
      if(flags & kwsysSystem_Shell_Flag_Make)
        {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        *out++ = '$';
        *out++ = '$';
        }
      else if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        *out++ = '"';
        *out++ = '$';
        *out++ = '"';
        }
      else
        {
        /* Otherwise a dollar is written just $. */
        *out++ = '$';
        }
      }
    else if(*c == '#')
      {
      if((flags & kwsysSystem_Shell_Flag_Make) &&
         (flags & kwsysSystem_Shell_Flag_WatcomWMake))
        {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        *out++ = '$';
        *out++ = '#';
        }
      else
        {
        /* Otherwise a pound is written just #. */
        *out++ = '#';
        }
      }
    else if(*c == '%')
      {
      if((flags & kwsysSystem_Shell_Flag_VSIDE) ||
         ((flags & kwsysSystem_Shell_Flag_Make) &&
          ((flags & kwsysSystem_Shell_Flag_MinGWMake) ||
           (flags & kwsysSystem_Shell_Flag_NMake))))
        {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        *out++ = '%';
        *out++ = '%';
        }
      else
        {
        /* Otherwise a percent is written just %. */
        *out++ = '%';
        }
      }
    else if(*c == ';')
      {
      if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        *out++ = '"';
        *out++ = ';';
        *out++ = '"';
        }
      else
        {
        /* Otherwise a semicolon is written just ;. */
        *out++ = ';';
        }
      }
    else
      {
      /* Store this character.  */
      *out++ = *c;
      }
    }

  if(needQuotes)
    {
    /* Add enough backslashes to escape any trailing ones.  */
    while(windows_backslashes > 0)
      {
      --windows_backslashes;
      *out++ = '\\';
      }

    /* Add the closing quote for this argument.  */
    if(flags & kwsysSystem_Shell_Flag_WatcomQuote)
      {
      *out++ = '\'';
      if(isUnix)
        {
        *out++ = '"';
        }
      }
    else
      {
      *out++ = '"';
      }
    }

  /* Store a terminating null without incrementing.  */
  *out = 0;

  return out;
}